

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# DHPrivateKey.cpp
# Opt level: O2

ByteString * __thiscall
DHPrivateKey::serialise(ByteString *__return_storage_ptr__,DHPrivateKey *this)

{
  ByteString local_b0;
  ByteString local_88;
  ByteString local_60;
  ByteString local_38;
  
  ByteString::serialise(&local_60,&this->p);
  ByteString::serialise(&local_88,&this->g);
  operator+(&local_38,&local_60,&local_88);
  ByteString::serialise(&local_b0,&this->x);
  operator+(__return_storage_ptr__,&local_38,&local_b0);
  ByteString::~ByteString(&local_b0);
  ByteString::~ByteString(&local_38);
  ByteString::~ByteString(&local_88);
  ByteString::~ByteString(&local_60);
  return __return_storage_ptr__;
}

Assistant:

ByteString DHPrivateKey::serialise() const
{
	return p.serialise() +
	       g.serialise() +
	       x.serialise();
}